

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1656fb::SerialQueueImpl::sync(SerialQueueImpl *this)

{
  bool bVar1;
  function *in_RSI;
  undefined1 local_c8 [8];
  unique_lock<std::mutex> lock;
  function<void_()> local_98;
  byte local_71;
  undefined1 local_70 [7];
  bool isComplete;
  mutex isCompleteMutex;
  condition_variable cv;
  function<void_()> *fn_local;
  SerialQueueImpl *this_local;
  
  bVar1 = std::function::operator_cast_to_bool(in_RSI);
  if (!bVar1) {
    __assert_fail("fn",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/SerialQueue.cpp"
                  ,0x68,"void (anonymous namespace)::SerialQueueImpl::sync(std::function<void ()>)")
    ;
  }
  std::condition_variable::condition_variable
            ((condition_variable *)&isCompleteMutex.super___mutex_base._M_mutex.__data.__list.__next
            );
  memset(local_70,0,0x28);
  std::mutex::mutex((mutex *)local_70);
  local_71 = 0;
  std::function<void()>::
  function<(anonymous_namespace)::SerialQueueImpl::sync(std::function<void()>)::_lambda()_1_,void>
            ((function<void()> *)&local_98,(anon_class_32_4_9e7a3747 *)&lock._M_owns);
  addOperation(this,&local_98);
  std::function<void_()>::~function(&local_98);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_c8,(mutex_type *)local_70);
  while (((local_71 ^ 0xff) & 1) != 0) {
    std::condition_variable::wait
              ((unique_lock *)&isCompleteMutex.super___mutex_base._M_mutex.__data.__list.__next);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
  std::condition_variable::~condition_variable
            ((condition_variable *)&isCompleteMutex.super___mutex_base._M_mutex.__data.__list.__next
            );
  return;
}

Assistant:

void sync(std::function<void(void)> fn) {
    assert(fn);
    
    // Add an operation which will execute the function and signal its
    // completion.
    std::condition_variable cv{};
    std::mutex isCompleteMutex{};
    bool isComplete = false;
    addOperation([&]() {
        fn();
        {
          std::unique_lock<std::mutex> lock(isCompleteMutex);
          isComplete = true;
          cv.notify_one();
        }
      });

    // Wait for the operation to complete.
    std::unique_lock<std::mutex> lock(isCompleteMutex);
    while (!isComplete) {
      cv.wait(lock);
    }
  }